

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::RecreateBuffersTest
          (RecreateBuffersTest *this,Context *context,FboConfig *config,deUint32 buffers,bool rebind
          )

{
  char *pcVar1;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_25;
  deUint32 local_24;
  bool rebind_local;
  FboConfig *pFStack_20;
  deUint32 buffers_local;
  FboConfig *config_local;
  Context *context_local;
  RecreateBuffersTest *this_local;
  
  local_25 = rebind;
  local_24 = buffers;
  pFStack_20 = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  FboConfig::getName_abi_cxx11_(&local_68,config);
  pcVar1 = "_no_rebind";
  if ((local_25 & 1) != 0) {
    pcVar1 = "";
  }
  std::operator+(&local_48,&local_68,pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,pcVar1,"Recreate buffers",pFStack_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RecreateBuffersTest_032a3050;
  this->m_buffers = local_24;
  this->m_rebind = (bool)(local_25 & 1);
  return;
}

Assistant:

RecreateBuffersTest::RecreateBuffersTest (Context& context, const FboConfig& config, deUint32 buffers, bool rebind)
	: FboRenderCase		(context, (string(config.getName()) + (rebind ? "" : "_no_rebind")).c_str(), "Recreate buffers", config)
	, m_buffers			(buffers)
	, m_rebind			(rebind)
{
}